

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O3

AABB * __thiscall IceMaths::AABB::Add(AABB *this,AABB *aabb)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar15 = (this->mCenter).x;
  fVar19 = (this->mExtents).x;
  fVar17 = (aabb->mCenter).x;
  fVar18 = (aabb->mExtents).x;
  uVar1 = (this->mCenter).y;
  uVar5 = (this->mCenter).z;
  uVar2 = (this->mExtents).y;
  uVar6 = (this->mExtents).z;
  auVar13._0_4_ = (float)uVar1 - (float)uVar2;
  auVar13._4_4_ = (float)uVar5 - (float)uVar6;
  auVar13._8_8_ = 0;
  uVar3 = (aabb->mCenter).y;
  uVar7 = (aabb->mCenter).z;
  uVar4 = (aabb->mExtents).y;
  uVar8 = (aabb->mExtents).z;
  auVar14._4_4_ = (float)uVar7 - (float)uVar8;
  auVar14._0_4_ = (float)uVar3 - (float)uVar4;
  auVar14._8_8_ = 0;
  auVar14 = minps(auVar13,auVar14);
  fVar16 = fVar15 - fVar19;
  fVar15 = fVar15 + fVar19;
  fVar19 = fVar17 - fVar18;
  fVar17 = fVar17 + fVar18;
  uVar9 = -(uint)(fVar16 < fVar19);
  uVar10 = -(uint)((float)uVar4 + (float)uVar3 < (float)uVar2 + (float)uVar1);
  uVar11 = -(uint)((float)uVar8 + (float)uVar7 < (float)uVar6 + (float)uVar5);
  uVar12 = -(uint)(fVar17 < fVar15);
  fVar19 = (float)(~uVar9 & (uint)fVar19 | (uint)fVar16 & uVar9);
  fVar18 = (float)(~uVar10 & (uint)((float)uVar4 + (float)uVar3) |
                  (uint)((float)uVar2 + (float)uVar1) & uVar10);
  fVar16 = (float)(~uVar11 & (uint)((float)uVar8 + (float)uVar7) |
                  (uint)((float)uVar6 + (float)uVar5) & uVar11);
  fVar15 = (float)(~uVar12 & (uint)fVar17 | (uint)fVar15 & uVar12);
  (this->mCenter).x = (fVar15 + fVar19) * 0.5;
  (this->mCenter).y = (auVar14._0_4_ + fVar18) * 0.5;
  (this->mCenter).z = (auVar14._4_4_ + fVar16) * 0.5;
  (this->mExtents).x = (fVar15 - fVar19) * 0.5;
  (this->mExtents).y = (fVar18 - auVar14._0_4_) * 0.5;
  (this->mExtents).z = (fVar16 - auVar14._4_4_) * 0.5;
  return this;
}

Assistant:

AABB& AABB::Add(const AABB& aabb)
{
	// Compute new min & max values
	Point Min;	GetMin(Min);
	Point Tmp;	aabb.GetMin(Tmp);
	Min.Min(Tmp);

	Point Max;	GetMax(Max);
	aabb.GetMax(Tmp);
	Max.Max(Tmp);

	// Update this
	SetMinMax(Min, Max);
	return *this;
}